

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void dec_parse_sao_param(com_core_t *core,int lcu_idx,com_sao_param_t *sao_cur_param)

{
  com_lbac_t *lbac;
  byte bVar1;
  byte bVar2;
  char cVar3;
  com_seqh_t *pcVar4;
  s8 *psVar5;
  byte *pbVar6;
  byte *pbVar7;
  u32 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  byte *pbVar16;
  uint uVar17;
  com_sao_param_t *saopara_src;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  ulong uStack_70;
  
  if ((((core->pathdr).slice_sao_enable[0] == '\0') && ((core->pathdr).slice_sao_enable[1] == '\0'))
     && ((core->pathdr).slice_sao_enable[2] == '\0')) {
    sao_cur_param->enable = 0;
    sao_cur_param[1].enable = 0;
    sao_cur_param[2].enable = 0;
    return;
  }
  pcVar4 = core->seqhdr;
  psVar5 = (core->map).map_patch;
  lVar15 = (long)lcu_idx;
  bVar22 = false;
  bVar21 = false;
  if (core->lcu_y != 0) {
    bVar21 = psVar5[lVar15] == psVar5[lVar15 - pcVar4->pic_width_in_lcu];
  }
  if (core->lcu_x != 0) {
    bVar22 = psVar5[lVar15] == psVar5[lVar15 + -1];
  }
  lbac = &core->lbac;
  if (bVar22 == false && bVar21 == false) {
LAB_0013acb1:
    lVar15 = 0;
    do {
      if (lVar15 == 3) {
        return;
      }
      if (((core->pathdr).slice_sao_enable[lVar15] == '\0') ||
         (uVar8 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_mode), uVar8 != 0)) {
        sao_cur_param[lVar15].enable = 0;
      }
      else {
        uVar8 = lbac_dec_bin_ep(lbac);
        sao_cur_param[lVar15].enable = 1;
        sao_cur_param[lVar15].type = (uint)(uVar8 != 0) << 2;
        sao_cur_param[lVar15].offset[2] = 0;
        for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
          if (sao_cur_param[lVar15].type == 4) {
            uVar8 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_offset);
            uStack_70 = uVar19;
            uVar17 = uVar8 ^ 1;
            if (uVar8 == 0) {
              iVar9 = (core->lbac).range * 0x10000;
              uVar20 = 0;
              uVar13 = (core->lbac).low;
              do {
                iVar10 = 0;
                if (iVar9 < (int)uVar13) {
                  iVar10 = iVar9;
                }
                uVar17 = (uVar13 - iVar10) * 2;
                if ((uVar13 & 0x7fff) == 0) {
                  uVar11 = (int)(uVar17 - 1 ^ uVar17) >> 0xf;
                  iVar10 = 0x1f;
                  if (uVar11 != 0) {
                    for (; uVar11 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                    }
                  }
                  pbVar6 = (core->lbac).cur;
                  pbVar7 = (core->lbac).end;
                  bVar1 = *pbVar6;
                  bVar2 = pbVar6[1];
                  pbVar16 = pbVar6 + 2;
                  if (pbVar7 <= pbVar6 + 2) {
                    pbVar16 = pbVar7;
                  }
                  (core->lbac).cur = pbVar16;
                  uVar17 = ((uint)bVar1 * 0x200 + -0xffff + (uint)bVar2 * 2 <<
                           (0x1e - ((byte)iVar10 ^ 0x1f) & 0x1f)) + uVar17;
                }
                uVar20 = uVar20 + ((int)uVar13 <= iVar9);
              } while ((uVar20 < 6) && (bVar21 = (int)uVar13 <= iVar9, uVar13 = uVar17, bVar21));
              (core->lbac).low = uVar17;
              uVar20 = uVar20 + (uVar8 ^ 1);
              uVar8 = lbac_dec_bin_ep(lbac);
              uVar17 = -uVar20;
              if (uVar8 == 0) {
                uVar17 = uVar20;
              }
            }
          }
          else {
            uVar20 = ((int)uVar19 + 1) - (uint)(uVar19 < 2);
            uStack_70 = (ulong)uVar20;
            cVar3 = dec_parse_sao_offset_saoclip[uStack_70 * 3 + 2];
            iVar9 = (core->lbac).range * 0x10000;
            uVar17 = 0;
            uVar13 = (core->lbac).low;
            do {
              iVar10 = 0;
              if (iVar9 < (int)uVar13) {
                iVar10 = iVar9;
              }
              uVar11 = (uVar13 - iVar10) * 2;
              if ((uVar13 & 0x7fff) == 0) {
                uVar12 = (int)(uVar11 - 1 ^ uVar11) >> 0xf;
                iVar10 = 0x1f;
                if (uVar12 != 0) {
                  for (; uVar12 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                  }
                }
                pbVar6 = (core->lbac).cur;
                pbVar7 = (core->lbac).end;
                bVar1 = *pbVar6;
                bVar2 = pbVar6[1];
                pbVar16 = pbVar6 + 2;
                if (pbVar7 <= pbVar6 + 2) {
                  pbVar16 = pbVar7;
                }
                (core->lbac).cur = pbVar16;
                uVar11 = ((uint)bVar1 * 0x200 + -0xffff + (uint)bVar2 * 2 <<
                         (0x1e - ((byte)iVar10 ^ 0x1f) & 0x1f)) + uVar11;
              }
              uVar17 = uVar17 + ((int)uVar13 <= iVar9);
            } while ((uVar17 < (uint)(int)cVar3) &&
                    (bVar21 = (int)uVar13 <= iVar9, uVar13 = uVar11, bVar21));
            (core->lbac).low = uVar11;
            if (uStack_70 == 4) {
              uVar17 = (uint)*(char *)((long)&dec_parse_sao_offset_EO_OFFSET_INV__MAP +
                                      (long)(int)uVar17);
              uStack_70 = 4;
            }
            else {
              if (uVar20 != 3) {
                if (uVar20 == 0) {
                  uStack_70 = 0;
                  uVar17 = (int)*(char *)((long)&dec_parse_sao_offset_EO_OFFSET_INV__MAP +
                                         (long)(int)uVar17);
                }
                goto LAB_0013af32;
              }
              uStack_70 = 3;
            }
            uVar17 = -uVar17;
          }
LAB_0013af32:
          sao_cur_param[lVar15].offset[uStack_70] = uVar17;
        }
        uVar13 = (core->lbac).low;
        iVar9 = (core->lbac).range * 0x10000;
        if (sao_cur_param[lVar15].type == 4) {
          uVar17 = 0;
          for (iVar10 = 0; iVar10 != 5; iVar10 = iVar10 + 1) {
            bVar21 = iVar9 < (int)uVar13;
            iVar18 = 0;
            if (iVar9 < (int)uVar13) {
              iVar18 = iVar9;
            }
            uVar11 = (uVar13 - iVar18) * 2;
            uVar20 = uVar13 & 0x7fff;
            uVar13 = uVar11;
            if (uVar20 == 0) {
              uVar13 = (int)(uVar11 - 1 ^ uVar11) >> 0xf;
              iVar18 = 0x1f;
              if (uVar13 != 0) {
                for (; uVar13 >> iVar18 == 0; iVar18 = iVar18 + -1) {
                }
              }
              pbVar6 = (core->lbac).cur;
              pbVar7 = (core->lbac).end;
              bVar1 = *pbVar6;
              bVar2 = pbVar6[1];
              pbVar16 = pbVar6 + 2;
              if (pbVar7 <= pbVar6 + 2) {
                pbVar16 = pbVar7;
              }
              (core->lbac).cur = pbVar16;
              uVar13 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar18 ^ 0x1f) & 0x1f)) + uVar11;
            }
            uVar17 = uVar17 | (uint)bVar21 << ((byte)iVar10 & 0x1f);
          }
          (core->lbac).low = uVar13;
          uVar20 = 0;
          do {
            bVar21 = iVar9 < (int)uVar13;
            bVar22 = (int)uVar13 <= iVar9;
            iVar10 = 0;
            if (iVar9 < (int)uVar13) {
              iVar10 = iVar9;
            }
            uVar12 = (uVar13 - iVar10) * 2;
            uVar11 = uVar13 & 0x7fff;
            uVar13 = uVar12;
            if (uVar11 == 0) {
              uVar13 = (int)(uVar12 - 1 ^ uVar12) >> 0xf;
              iVar10 = 0x1f;
              if (uVar13 != 0) {
                for (; uVar13 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                }
              }
              pbVar6 = (core->lbac).cur;
              pbVar7 = (core->lbac).end;
              bVar1 = *pbVar6;
              bVar2 = pbVar6[1];
              pbVar16 = pbVar6 + 2;
              if (pbVar7 <= pbVar6 + 2) {
                pbVar16 = pbVar7;
              }
              (core->lbac).cur = pbVar16;
              uVar13 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar10 ^ 0x1f) & 0x1f)) + uVar12;
            }
            uVar20 = uVar20 + bVar22;
          } while ((bool)(~bVar21 & uVar20 < 3));
          (core->lbac).low = uVar13;
          iVar10 = 0;
          for (iVar18 = uVar20 + (uint)(uVar20 < 3) * 4 + -3; 0 < iVar18; iVar18 = iVar18 + -1) {
            bVar21 = iVar9 < (int)uVar13;
            iVar14 = 0;
            if (iVar9 < (int)uVar13) {
              iVar14 = iVar9;
            }
            uVar12 = (uVar13 - iVar14) * 2;
            uVar11 = uVar13 & 0x7fff;
            uVar13 = uVar12;
            if (uVar11 == 0) {
              uVar13 = (int)(uVar12 - 1 ^ uVar12) >> 0xf;
              iVar14 = 0x1f;
              if (uVar13 != 0) {
                for (; uVar13 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                }
              }
              pbVar6 = (core->lbac).cur;
              pbVar7 = (core->lbac).end;
              bVar1 = *pbVar6;
              bVar2 = pbVar6[1];
              pbVar16 = pbVar6 + 2;
              if (pbVar7 <= pbVar6 + 2) {
                pbVar16 = pbVar7;
              }
              (core->lbac).cur = pbVar16;
              uVar13 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar14 ^ 0x1f) & 0x1f)) + uVar12;
            }
            iVar10 = (uint)bVar21 + iVar10 * 2;
          }
          (core->lbac).low = uVar13;
          sao_cur_param[lVar15].bandIdx[0] = uVar17;
          sao_cur_param[lVar15].bandIdx[1] = (int)(uVar17 + 1) % 0x20;
          iVar9 = (2 << ((byte)uVar20 & 0x1f)) + uVar17;
          sao_cur_param[lVar15].bandIdx[2] = (iVar9 + iVar10) % 0x20;
          sao_cur_param[lVar15].bandIdx[3] = (iVar10 + iVar9 + 1) % 0x20;
        }
        else {
          uVar17 = 0;
          for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
            bVar21 = iVar9 < (int)uVar13;
            iVar18 = 0;
            if (iVar9 < (int)uVar13) {
              iVar18 = iVar9;
            }
            uVar11 = (uVar13 - iVar18) * 2;
            uVar20 = uVar13 & 0x7fff;
            uVar13 = uVar11;
            if (uVar20 == 0) {
              uVar13 = (int)(uVar11 - 1 ^ uVar11) >> 0xf;
              iVar18 = 0x1f;
              if (uVar13 != 0) {
                for (; uVar13 >> iVar18 == 0; iVar18 = iVar18 + -1) {
                }
              }
              pbVar6 = (core->lbac).cur;
              pbVar7 = (core->lbac).end;
              bVar1 = *pbVar6;
              bVar2 = pbVar6[1];
              pbVar16 = pbVar6 + 2;
              if (pbVar7 <= pbVar6 + 2) {
                pbVar16 = pbVar7;
              }
              (core->lbac).cur = pbVar16;
              uVar13 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar18 ^ 0x1f) & 0x1f)) + uVar11;
            }
            uVar17 = uVar17 | (uint)bVar21 << ((byte)iVar10 & 0x1f);
          }
          (core->lbac).low = uVar13;
          sao_cur_param[lVar15].type = uVar17;
        }
      }
      lVar15 = lVar15 + 1;
    } while( true );
  }
  if ((char)(bVar22 + bVar21) == '\x02') {
    uVar8 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag + 1);
    if (uVar8 == 0) {
      uVar8 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag + 2);
      uVar8 = uVar8 * 2;
    }
    else {
      uVar8 = 1;
    }
  }
  else {
    uVar8 = 0;
    if ((char)(bVar22 + bVar21) == '\x01') {
      uVar8 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag);
    }
  }
  if ((bVar21 == false) && (bVar22 != false)) {
    if (uVar8 == 0) goto LAB_0013acb1;
  }
  else {
    if ((bVar21 == false) || (bVar22 != false)) {
      if (uVar8 == 0) goto LAB_0013acb1;
      uVar13 = 3 - uVar8;
    }
    else {
      uVar13 = (uint)(uVar8 != 0);
    }
    if (uVar13 != 2) {
      if (uVar13 == 0) goto LAB_0013acb1;
      saopara_src = core->sao_param_map[lVar15 - pcVar4->pic_width_in_lcu];
      goto LAB_0013b25c;
    }
  }
  saopara_src = core->sao_param_map[lVar15 + -1];
LAB_0013b25c:
  copy_sao_param(sao_cur_param,saopara_src);
  return;
}

Assistant:

void dec_parse_sao_param(com_core_t* core, int lcu_idx, com_sao_param_t *sao_cur_param)
{
    com_patch_header_t *sh = &core->pathdr;

    if (!sh->slice_sao_enable[Y_C] && !sh->slice_sao_enable[U_C] && !sh->slice_sao_enable[V_C]) {
        sao_cur_param[0].enable = 0;
        sao_cur_param[1].enable = 0;
        sao_cur_param[2].enable = 0;
    } else {
        com_seqh_t *seqhdr = core->seqhdr;
        com_lbac_t *lbac = &core->lbac;
        int cur_patch = core->map.map_patch[lcu_idx];
        int MergeUpAvail   = (core->lcu_y == 0) ? 0 : cur_patch == core->map.map_patch[lcu_idx - seqhdr->pic_width_in_lcu];
        int MergeLeftAvail = (core->lcu_x == 0) ? 0 : cur_patch == core->map.map_patch[lcu_idx -                      1];
        int mergemode = 0;

        if (MergeLeftAvail + MergeUpAvail > 0) {
            mergemode = dec_parse_sao_mergeflag(lbac, MergeLeftAvail, MergeUpAvail);
        }
        if (mergemode) {
            if (mergemode == 2) {
                copy_sao_param(sao_cur_param, core->sao_param_map[lcu_idx - 1]);
            } else {
                copy_sao_param(sao_cur_param, core->sao_param_map[lcu_idx - seqhdr->pic_width_in_lcu]);
            }
        } else {
            int compIdx;

            for (compIdx = Y_C; compIdx < N_C; compIdx++) {
                if (!sh->slice_sao_enable[compIdx]) {
                    sao_cur_param[compIdx].enable = 0;
                } else {
                    switch (dec_parse_sao_mode(lbac)) {
                    case 0:
                        sao_cur_param[compIdx].enable = 0;
                        break;
                    case 1:
                        sao_cur_param[compIdx].enable = 1;
                        sao_cur_param[compIdx].type = SAO_TYPE_BO;
                        break;
                    case 2:
                        sao_cur_param[compIdx].enable = 1;
                        sao_cur_param[compIdx].type = SAO_TYPE_EO_0;
                        break;
                    default:
                        uavs3d_assert(0);
                        break;
                    }

                    if (sao_cur_param[compIdx].enable) {
                        dec_parse_sao_offset(lbac, &(sao_cur_param[compIdx]), sao_cur_param[compIdx].offset);

                        if (sao_cur_param[compIdx].type == SAO_TYPE_BO) {
                            dec_parse_sao_bo_start(lbac, &(sao_cur_param[compIdx]), sao_cur_param[compIdx].bandIdx);
                        } else {
                            sao_cur_param[compIdx].type = dec_parse_sao_eo_type(lbac, &(sao_cur_param[compIdx]));
                        }
                    }
                }
            }
        }
    }
}